

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPlugin.hpp
# Opt level: O2

void __thiscall DISTRHO::Parameter::initDesignation(Parameter *this,ParameterDesignation d)

{
  this->designation = d;
  if (d == kParameterDesignationBypass) {
    this->hints = 7;
    String::operator=(&this->name,"Bypass");
    String::operator=(&this->shortName,"Bypass");
    String::operator=(&this->symbol,"dpf_bypass");
    String::operator=(&this->unit,"");
    this->midiCC = '\0';
    this->groupId = 0xffffffff;
    (this->ranges).def = 0.0;
    (this->ranges).min = 0.0;
    (this->ranges).max = 1.0;
  }
  return;
}

Assistant:

void initDesignation(ParameterDesignation d) noexcept
    {
        designation = d;

        switch (d)
        {
        case kParameterDesignationNull:
            break;
        case kParameterDesignationBypass:
            hints      = kParameterIsAutomatable|kParameterIsBoolean|kParameterIsInteger;
            name       = "Bypass";
            shortName  = "Bypass";
            symbol     = "dpf_bypass";
            unit       = "";
            midiCC     = 0;
            groupId    = kPortGroupNone;
            ranges.def = 0.0f;
            ranges.min = 0.0f;
            ranges.max = 1.0f;
            break;
        }
    }